

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcc_uint.c
# Opt level: O3

qcc_uint qcc_generate_uint(qcc_generator_ptr gen)

{
  qcc_uint qVar1;
  uint8_t res;
  uint16_t res_2;
  uint32_t res_1;
  uint64_t res_3;
  byte local_17;
  ushort local_16;
  uint local_14;
  qcc_uint local_10;
  
  qVar1 = 0;
  switch(gen->type_size) {
  case 1:
    qcc_generate(gen,&local_17);
    qVar1 = (qcc_uint)local_17;
    break;
  case 2:
    qcc_generate(gen,&local_16);
    qVar1 = (qcc_uint)local_16;
    break;
  case 4:
    qcc_generate(gen,&local_14);
    qVar1 = (qcc_uint)local_14;
    break;
  case 8:
    qcc_generate(gen,&local_10);
    qVar1 = local_10;
  }
  return qVar1;
}

Assistant:

qcc_uint qcc_generate_uint(qcc_generator_ptr gen)
{
    switch (gen->type_size)
    {
    case 1:
    {
        uint8_t res;
        qcc_generate(gen, &res);
        return res;
    }
    case 2:
    {
        uint16_t res;
        qcc_generate(gen, &res);
        return res;
    }
    case 4:
    {
        uint32_t res;
        qcc_generate(gen, &res);
        return res;
    }
    case 8:
    {
        uint64_t res;
        qcc_generate(gen, &res);
        return res;
    }
    }
    /* TODO: Raise error */
    return 0;
}